

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O0

string __thiscall
mjs::anon_unknown_37::date_helper::to_date_string(date_helper *this,gc_heap *h,double t)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  string sVar3;
  wstring local_230 [32];
  wstring_view local_210 [2];
  _Put_time<wchar_t> local_1f0;
  wostringstream local_1e0 [8];
  wostringstream woss;
  undefined1 local_68 [8];
  tm tm;
  double t_local;
  gc_heap *h_local;
  
  bVar1 = std::isfinite(t);
  if (bVar1) {
    tm_from_time((tm *)local_68,t);
    std::__cxx11::wostringstream::wostringstream(local_1e0);
    local_1f0 = std::put_time<wchar_t>((tm *)local_68,L"%a %b %d %Y");
    std::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_1e0,local_1f0);
    std::__cxx11::wostringstream::str();
    local_210[0] = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view(local_230);
    string::string((string *)this,h,local_210);
    std::__cxx11::wstring::~wstring(local_230);
    std::__cxx11::wostringstream::~wostringstream(local_1e0);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&tm.tm_zone,L"Invalid Date"
              );
    string::string((string *)this,h,(wstring_view *)&tm.tm_zone);
    uVar2 = extraout_RDX;
  }
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar2;
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

static string to_date_string(gc_heap& h, double t) {
        if (!std::isfinite(t)) return string{h, invalid_date_string};
        const auto tm = tm_from_time(t);
        std::wostringstream woss;
        woss << std::put_time(&tm, L"%a %b %d %Y");
        return string{h, woss.str()};
    }